

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall toml::detail::sequence::expected_chars_abi_cxx11_(sequence *this,location *loc)

{
  bool bVar1;
  location *in_RSI;
  string *in_RDI;
  region reg;
  scanner_storage *other;
  const_iterator __end2;
  const_iterator __begin2;
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *__range2;
  location first;
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
  *in_stack_fffffffffffffed8;
  region *in_stack_fffffffffffffee0;
  string *this_00;
  location *in_stack_ffffffffffffff00;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
  local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_68;
  
  this_00 = in_RDI;
  location::location(in_stack_ffffffffffffff00,in_RSI);
  local_68 = &(in_RSI->source_).
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  local_70._M_current =
       (scanner_storage *)
       std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
       begin(in_stack_fffffffffffffed8);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::end
            (in_stack_fffffffffffffed8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                           ((__normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                             *)in_stack_fffffffffffffee0,
                            (__normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                             *)in_stack_fffffffffffffed8), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
    ::operator*(&local_70);
    scanner_storage::scan((scanner_storage *)this_00,(location *)in_stack_fffffffffffffee0);
    bVar1 = region::is_ok((region *)0x37bad4);
    if (!bVar1) {
      scanner_storage::expected_chars_abi_cxx11_
                ((scanner_storage *)this_00,(location *)in_stack_fffffffffffffee0);
    }
    region::~region(in_stack_fffffffffffffee0);
    if (!bVar1) goto LAB_0037bbb3;
    __gnu_cxx::
    __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
    ::operator++(&local_70);
  }
  in_stack_fffffffffffffee0 = (region *)&stack0xffffffffffffff07;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
LAB_0037bbb3:
  location::~location((location *)in_stack_fffffffffffffee0);
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string sequence::expected_chars(location& loc) const
{
    const auto first = loc;
    for(const auto& other : others_)
    {
        const auto reg = other.scan(loc);
        if( ! reg.is_ok())
        {
            return other.expected_chars(loc);
        }
    }
    assert(false);
    return ""; // XXX
}